

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O3

ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> * __thiscall
testing::ByMove<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>>
          (ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>
           *__return_storage_ptr__,testing *this,
          unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> *x)

{
  _Manager_type p_Var1;
  SDL_Window_conflict *pSVar2;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type p_Stack_20;
  undefined8 local_18;
  
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_28 = (_Manager_type)0x0;
  p_Stack_20 = *(_Invoker_type *)(this + 0x18);
  p_Var1 = *(_Manager_type *)(this + 0x10);
  if (p_Var1 != (_Manager_type)0x0) {
    local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)this;
    local_38._8_8_ = *(undefined8 *)(this + 8);
    *(undefined8 *)(this + 0x10) = 0;
    *(undefined8 *)(this + 0x18) = 0;
    local_28 = p_Var1;
  }
  pSVar2 = *(SDL_Window_conflict **)(this + 0x20);
  *(undefined8 *)(this + 0x20) = 0;
  *(_Manager_type *)
   ((long)&(__return_storage_ptr__->payload)._M_t.
           super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
           super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> + 0x10) =
       (_Manager_type)0x0;
  *(undefined8 *)
   &(__return_storage_ptr__->payload)._M_t.
    super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
    super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
    super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
    super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->payload)._M_t.
           super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
           super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> + 8) = 0;
  *(_Invoker_type *)
   ((long)&(__return_storage_ptr__->payload)._M_t.
           super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
           super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> + 0x18) = p_Stack_20;
  if (p_Var1 != (_Manager_type)0x0) {
    *(void **)&(__return_storage_ptr__->payload)._M_t.
               super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
               super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
               super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
               super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> =
         local_38._M_unused._M_object;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->payload)._M_t.
             super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
             super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
             super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
             super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> + 8) = local_38._8_8_;
    *(_Manager_type *)
     ((long)&(__return_storage_ptr__->payload)._M_t.
             super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
             super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
             super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
             super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> + 0x10) = p_Var1;
    local_28 = (_Manager_type)0x0;
    p_Stack_20 = (_Invoker_type)0x0;
  }
  (__return_storage_ptr__->payload)._M_t.
  super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
  super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
  super__Head_base<0UL,_SDL_Window_*,_false>._M_head_impl = pSVar2;
  local_18 = 0;
  std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::~unique_ptr
            ((unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

internal::ByMoveWrapper<R> ByMove(R x) {
  return internal::ByMoveWrapper<R>(std::move(x));
}